

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O1

void k051649_w(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  k051649_state *info;
  
  if ((offset & 1) == 0) {
    *(UINT8 *)((long)chip + 0x101) = data;
    return;
  }
  switch(offset >> 1) {
  case '\0':
  case '\x04':
    bVar1 = *(byte *)((long)chip + 0x100);
    if (*(char *)((long)chip + 0x102) == '\0') {
      if (((bVar1 & 0x40) == 0) &&
         (bVar2 = *(byte *)((long)chip + 0x101), -1 < (char)bVar1 || bVar2 < 0x60)) {
        if (bVar2 < 0x60) {
          *(UINT8 *)((long)chip + (ulong)(bVar2 & 0x1f) + 0x12 + (ulong)(bVar2 >> 5) * 0x2c) = data;
          return;
        }
        uVar5 = (ulong)(bVar2 & 0x1f);
        *(UINT8 *)((long)chip + uVar5 + 0x96) = data;
        *(UINT8 *)((long)chip + uVar5 + 0xc2) = data;
        return;
      }
    }
    else if ((bVar1 & 0x40) == 0) {
      *(UINT8 *)((long)chip +
                (ulong)(*(byte *)((long)chip + 0x101) & 0x1f) + 0x12 +
                (ulong)(*(byte *)((long)chip + 0x101) >> 5) * 0x2c) = data;
      return;
    }
    break;
  case '\x01':
    bVar1 = *(byte *)((long)chip + 0x101);
    bVar2 = bVar1 >> 1;
    puVar3 = (uint *)((long)chip + (ulong)bVar2 * 0x2c + 8);
    uVar6 = 0xffffffff;
    if ((*(byte *)((long)chip + 0x100) & 0x20) == 0) {
      if (8 < *(int *)((long)chip + (ulong)bVar2 * 0x2c + 0xc)) goto LAB_00164d8d;
      uVar6 = *puVar3 | 0xffff;
    }
    *puVar3 = uVar6;
LAB_00164d8d:
    uVar6 = *(uint *)((long)chip + (ulong)bVar2 * 0x2c + 0xc);
    if ((bVar1 & 1) == 0) {
      uVar6 = (uint)data | uVar6 & 0xf00;
    }
    else {
      uVar6 = (data & 0xf) << 8 | uVar6 & 0xff;
    }
    *(uint *)((long)chip + (ulong)bVar2 * 0x2c + 0xc) = uVar6;
    *puVar3 = (uint)*(ushort *)((long)chip + (ulong)bVar2 * 0x2c + 10) << 0x10;
    return;
  case '\x02':
    *(byte *)((long)chip + (ulong)(*(byte *)((long)chip + 0x101) & 7) * 0x2c + 0x10) = data & 0xf;
    return;
  case '\x03':
    lVar4 = 0x11;
    do {
      *(byte *)((long)chip + lVar4) = data & 1;
      data = data >> 1;
      lVar4 = lVar4 + 0x2c;
    } while (lVar4 != 0xed);
    break;
  case '\x05':
    *(UINT8 *)((long)chip + 0x100) = data;
    return;
  }
  return;
}

Assistant:

static void k051649_w(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	switch(offset & 1)
	{
	case 0x00:
		info->cur_reg = data;
		break;
	case 0x01:
		switch(offset >> 1)
		{
		case 0x00:
		case 0x04:
			if (! info->mode_plus)
				k051649_waveform_w(chip, info->cur_reg, data);
			else
				k052539_waveform_w(chip, info->cur_reg, data);
			break;
		case 0x01:
			k051649_frequency_w(chip, info->cur_reg, data);
			break;
		case 0x02:
			k051649_volume_w(chip, info->cur_reg, data);
			break;
		case 0x03:
			k051649_keyonoff_w(chip, info->cur_reg, data);
			break;
		case 0x05:
			k051649_test_w(chip, info->cur_reg, data);
			break;
		}
		break;
	}
	
	return;
}